

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                    *this,XprType *xpr)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  PointerType pfVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  Index size;
  Index index;
  ulong uVar11;
  long lVar12;
  
  (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)0x0;
  (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  fVar3 = (xpr->m_lhs).m_lhs.m_functor.m_other;
  pfVar4 = (xpr->m_lhs).m_rhs.
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
           .m_data;
  uVar11 = (xpr->m_lhs).m_rhs.
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
           .m_rows.m_value;
  if ((this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar11) {
    if ((long)uVar11 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                   );
    }
    DenseStorage<float,_-1,_-1,_1,_0>::resize
              ((DenseStorage<float,__1,__1,_1,_0> *)this,uVar11,uVar11,1);
  }
  uVar5 = (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar5 == uVar11) {
    pfVar6 = (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar11 = uVar5 + 3;
    if (-1 < (long)uVar5) {
      uVar11 = uVar5;
    }
    uVar11 = uVar11 & 0xfffffffffffffffc;
    if (3 < (long)uVar5) {
      lVar12 = 0;
      do {
        pfVar1 = pfVar4 + lVar12;
        fVar7 = pfVar1[1];
        fVar8 = pfVar1[2];
        fVar9 = pfVar1[3];
        pfVar2 = pfVar6 + lVar12;
        *pfVar2 = *pfVar1 * fVar3;
        pfVar2[1] = fVar7 * fVar3;
        pfVar2[2] = fVar8 * fVar3;
        pfVar2[3] = fVar9 * fVar3;
        lVar12 = lVar12 + 4;
      } while (lVar12 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar5) {
      do {
        pfVar6[uVar11] = pfVar4[uVar11] * fVar3;
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    uVar10 = *(undefined8 *)
              &(xpr->m_rhs).
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .field_0x8;
    (this->m_rhs).
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = (xpr->m_rhs).
             super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    *(undefined8 *)
     &(this->m_rhs).
      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      field_0x8 = uVar10;
    lVar12 = (xpr->m_rhs).
             super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value;
    (this->m_rhs).
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = lVar12;
    (this->m_lhsImpl).
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    (this->m_rhsImpl).
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>
    .m_data = (this->m_rhs).
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    (this->m_rhsImpl).
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>
    .m_outerStride.m_value = lVar12;
    this->m_innerDim = 1;
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<const Eigen::Matrix<float, -1, 8>, -1, 1>>, T1 = float, T2 = float]"
               );
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_lhs(xpr.lhs()),
      m_rhs(xpr.rhs()),
      m_lhsImpl(m_lhs),     // FIXME the creation of the evaluator objects should result in a no-op, but check that!
      m_rhsImpl(m_rhs),     //       Moreover, they are only useful for the packet path, so we could completely disable them when not needed,
                            //       or perhaps declare them on the fly on the packet method... We have experiment to check what's best.
      m_innerDim(xpr.lhs().cols())
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::MulCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::AddCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
#if 0
    std::cerr << "LhsOuterStrideBytes=  " << LhsOuterStrideBytes << "\n";
    std::cerr << "RhsOuterStrideBytes=  " << RhsOuterStrideBytes << "\n";
    std::cerr << "LhsAlignment=         " << LhsAlignment << "\n";
    std::cerr << "RhsAlignment=         " << RhsAlignment << "\n";
    std::cerr << "CanVectorizeLhs=      " << CanVectorizeLhs << "\n";
    std::cerr << "CanVectorizeRhs=      " << CanVectorizeRhs << "\n";
    std::cerr << "CanVectorizeInner=    " << CanVectorizeInner << "\n";
    std::cerr << "EvalToRowMajor=       " << EvalToRowMajor << "\n";
    std::cerr << "Alignment=            " << Alignment << "\n";
    std::cerr << "Flags=                " << Flags << "\n";
#endif
  }